

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O0

void __thiscall SQCompilation::CodegenVisitor::visitTerExpr(CodegenVisitor *this,TerExpr *expr)

{
  SQInteger SVar1;
  SQInteger SVar2;
  SQFuncState *this_00;
  SQInteger arg0;
  void *extraout_RDX;
  TerExpr *in_RSI;
  void *pvVar3;
  long in_RDI;
  SQInteger second_exp;
  SQInteger jmppos;
  SQInteger endfirstexp;
  SQInteger first_exp;
  SQInteger trg;
  SQInteger jzpos;
  SQInteger in_stack_ffffffffffffffa0;
  SQFuncState *in_stack_ffffffffffffffa8;
  CodegenVisitor *in_stack_ffffffffffffffb0;
  SQFuncState *this_01;
  SQInteger in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  SQOpcode _op;
  SQFuncState *in_stack_ffffffffffffffd0;
  
  _op = (SQOpcode)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  maybeAddInExprLine(in_stack_ffffffffffffffb0,(Expr *)in_stack_ffffffffffffffa8);
  TerExpr::a(in_RSI);
  visitForceGet(in_stack_ffffffffffffffb0,(Node *)in_stack_ffffffffffffffa8);
  this_01 = *(SQFuncState **)(in_RDI + 8);
  SQFuncState::PopTarget(this_01);
  SQFuncState::AddInstruction
            (in_stack_ffffffffffffffd0,_op,in_stack_ffffffffffffffc0,in_RDI,(SQInteger)this_01,
             (SQInteger)in_stack_ffffffffffffffa8);
  SQFuncState::GetCurrentPos((SQFuncState *)0x1ca73b);
  SVar1 = SQFuncState::PushTarget(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  TerExpr::b(in_RSI);
  visitForceGet((CodegenVisitor *)this_01,(Node *)in_stack_ffffffffffffffa8);
  SVar2 = SQFuncState::PopTarget(this_01);
  if (SVar1 != SVar2) {
    SQFuncState::AddInstruction
              (in_stack_ffffffffffffffd0,_op,in_stack_ffffffffffffffc0,in_RDI,(SQInteger)this_01,
               (SQInteger)in_stack_ffffffffffffffa8);
  }
  this_00 = (SQFuncState *)SQFuncState::GetCurrentPos((SQFuncState *)0x1ca7c6);
  pvVar3 = (void *)0x22;
  SQFuncState::AddInstruction
            (this_00,_op,in_stack_ffffffffffffffc0,in_RDI,(SQInteger)this_01,
             (SQInteger)in_stack_ffffffffffffffa8);
  SVar2 = SQFuncState::GetCurrentPos((SQFuncState *)0x1ca7fd);
  TerExpr::c(in_RSI,pvVar3,extraout_RDX);
  visitForceGet((CodegenVisitor *)this_01,(Node *)in_stack_ffffffffffffffa8);
  arg0 = SQFuncState::PopTarget(this_01);
  if (SVar1 != arg0) {
    SQFuncState::AddInstruction
              (this_00,(SQOpcode)((ulong)SVar2 >> 0x20),arg0,in_RDI,(SQInteger)this_01,
               (SQInteger)in_stack_ffffffffffffffa8);
  }
  SQFuncState::GetCurrentPos((SQFuncState *)0x1ca87e);
  SQFuncState::SetInstructionParam(this_00,SVar2,arg0,in_RDI);
  SQFuncState::SetInstructionParam(this_00,SVar2,arg0,in_RDI);
  SQFuncState::SnoozeOpt(*(SQFuncState **)(in_RDI + 8));
  return;
}

Assistant:

void CodegenVisitor::visitTerExpr(TerExpr *expr) {
    maybeAddInExprLine(expr);
    assert(expr->op() == TO_TERNARY);

    visitForceGet(expr->a());
    _fs->AddInstruction(_OP_JZ, _fs->PopTarget());
    SQInteger jzpos = _fs->GetCurrentPos();

    SQInteger trg = _fs->PushTarget();
    visitForceGet(expr->b());
    SQInteger first_exp = _fs->PopTarget();
    if (trg != first_exp) _fs->AddInstruction(_OP_MOVE, trg, first_exp);
    SQInteger endfirstexp = _fs->GetCurrentPos();
    _fs->AddInstruction(_OP_JMP, 0, 0);
    SQInteger jmppos = _fs->GetCurrentPos();

    visitForceGet(expr->c());
    SQInteger second_exp = _fs->PopTarget();
    if (trg != second_exp) _fs->AddInstruction(_OP_MOVE, trg, second_exp);

    _fs->SetInstructionParam(jmppos, 1, _fs->GetCurrentPos() - jmppos);
    _fs->SetInstructionParam(jzpos, 1, endfirstexp - jzpos + 1);
    _fs->SnoozeOpt();
}